

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void testing::internal::FailFromInternalError(int fd)

{
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  bool bVar4;
  int last_error;
  int num_read;
  char buffer [256];
  Message error;
  char (*in_stack_fffffffffffffe48) [256];
  Message *in_stack_fffffffffffffe50;
  Message *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  string local_178 [32];
  GTestLog local_158;
  int local_154;
  string local_150 [12];
  int in_stack_fffffffffffffebc;
  char *in_stack_fffffffffffffec0;
  GTestLogSeverity in_stack_fffffffffffffecc;
  GTestLog *in_stack_fffffffffffffed0;
  undefined1 local_118 [280];
  
  Message::Message((Message *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  do {
    while (iVar1 = posix::Read((int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                               in_stack_fffffffffffffe48,0), 0 < iVar1) {
      local_118[iVar1] = 0;
      Message::operator<<(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    }
    bVar4 = false;
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      bVar4 = *piVar2 == 4;
    }
  } while (bVar4);
  if (iVar1 == 0) {
    GTestLog::GTestLog(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0
                       ,in_stack_fffffffffffffebc);
    poVar3 = GTestLog::GetStream((GTestLog *)&stack0xfffffffffffffed0);
    Message::GetString_abi_cxx11_(in_stack_fffffffffffffe58);
    std::operator<<(poVar3,local_150);
    std::__cxx11::string::~string(local_150);
    GTestLog::~GTestLog((GTestLog *)in_stack_fffffffffffffe50);
  }
  else {
    piVar2 = __errno_location();
    local_154 = *piVar2;
    GTestLog::GTestLog(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0
                       ,in_stack_fffffffffffffebc);
    poVar3 = GTestLog::GetStream(&local_158);
    poVar3 = std::operator<<(poVar3,"Error while reading death test internal: ");
    GetLastErrnoDescription_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,local_178);
    poVar3 = std::operator<<(poVar3," [");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_154);
    std::operator<<(poVar3,"]");
    std::__cxx11::string::~string(local_178);
    GTestLog::~GTestLog((GTestLog *)poVar3);
  }
  Message::~Message((Message *)0x122f8a);
  return;
}

Assistant:

static void FailFromInternalError(int fd) {
  Message error;
  char buffer[256];
  int num_read;

  do {
    while ((num_read = posix::Read(fd, buffer, 255)) > 0) {
      buffer[num_read] = '\0';
      error << buffer;
    }
  } while (num_read == -1 && errno == EINTR);

  if (num_read == 0) {
    GTEST_LOG_(FATAL) << error.GetString();
  } else {
    const int last_error = errno;
    GTEST_LOG_(FATAL) << "Error while reading death test internal: "
                      << GetLastErrnoDescription() << " [" << last_error << "]";
  }
}